

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::HelpFlag::ParseValue
          (HelpFlag *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1)

{
  runtime_error *this_00;
  string asStack_38 [32];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  (*(this->super_Flag).super_FlagBase.super_NamedBase.super_Base._vptr_Base[0x12])(asStack_38,this);
  std::runtime_error::runtime_error(this_00,asStack_38);
  *(undefined ***)this_00 = &PTR__runtime_error_001ea458;
  __cxa_throw(this_00,&Help::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &)
            {
#ifdef ARGS_NOEXCEPT
                    error = Error::Help;
                    errorMsg = Name();
#else
                    throw Help(Name());
#endif
            }